

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

Abc_Cex_t * Bmc_CexCareExtendToObjects(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  char *__assertion;
  ulong local_58;
  
  if (pCex->nPis == pCexCare->nPis) {
    if (pCex->nRegs == pCexCare->nRegs) {
      if (pCex->nBits == pCexCare->nBits) {
        pAVar4 = Abc_CexAlloc(pCex->nRegs,p->nObjs,pCex->iFrame + 1);
        iVar11 = pCex->iFrame;
        pAVar4->iPo = pCex->iPo;
        pAVar4->iFrame = iVar11;
        *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
        for (iVar11 = 0; iVar11 < p->nRegs; iVar11 = iVar11 + 1) {
          pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar11);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xbfffffffbfffffff | 0x40000000;
        }
        local_58 = 0x4000000000000000;
        for (iVar11 = 0; iVar11 <= pCex->iFrame; iVar11 = iVar11 + 1) {
          for (iVar12 = 0; iVar12 < p->vCis->nSize - p->nRegs; iVar12 = iVar12 + 1) {
            pGVar5 = Gia_ManCi(p,iVar12);
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar9 = pCexCare->nPis * iVar11 + pCexCare->nRegs + iVar12;
            if (((uint)(&pCexCare[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) == 0) {
              uVar10 = *(ulong *)pGVar5 | 0x4000000040000000;
            }
            else {
              uVar9 = pCex->nPis * iVar11 + pCex->nRegs + iVar12;
              if (((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) == 0) {
                uVar10 = *(ulong *)pGVar5 & 0xbfffffffbfffffff | 0x40000000;
              }
              else {
                uVar10 = (*(ulong *)pGVar5 & 0xbfffffffbfffffff) + 0x4000000000000000;
              }
            }
            *(ulong *)pGVar5 = uVar10;
          }
          for (iVar12 = 0; iVar12 < p->nRegs; iVar12 = iVar12 + 1) {
            pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar12);
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            iVar2 = Gia_ObjIsRo(p,pGVar5);
            if (iVar2 == 0) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar2 = p->vCos->nSize;
            iVar1 = p->vCis->nSize;
            iVar3 = Gia_ObjCioId(pGVar5);
            pGVar6 = Gia_ManCo(p,(iVar2 - iVar1) + iVar3);
            iVar2 = Gia_ObjIsRo(p,pGVar5);
            if (iVar2 == 0) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x3b3,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((*(ulong *)pGVar6 & 0x4000000040000000) == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar7 = *(ulong *)pGVar6 & 0x40000000;
            uVar10 = *(ulong *)pGVar5;
            *(ulong *)pGVar5 = uVar10 & 0xffffffffbfffffff | uVar7;
            *(ulong *)pGVar5 =
                 uVar10 & 0xbfffffffbfffffff | uVar7 | *(ulong *)pGVar6 & 0x4000000000000000;
          }
          for (iVar12 = 0; iVar12 < p->nObjs; iVar12 = iVar12 + 1) {
            pGVar5 = Gia_ManObj(p,iVar12);
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar10 = *(ulong *)pGVar5;
            if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
              if (((undefined1  [12])pGVar5[-(uVar10 & 0x1fffffff)] &
                  (undefined1  [12])0x4000000040000000) == (undefined1  [12])0x0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x39c,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              uVar7 = *(ulong *)(pGVar5 + -(ulong)((uint)(uVar10 >> 0x20) & 0x1fffffff)) &
                      0x4000000040000000;
              if (uVar7 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              iVar2 = Gia_ObjTerSimGet0Fanin0(pGVar5);
              if (iVar2 == 0) {
                uVar8 = local_58;
                if ((uVar10 >> 0x3d & 1) == 0) {
                  uVar8 = 0x40000000;
                }
                if (uVar7 == uVar8) goto LAB_00482374;
                iVar2 = Gia_ObjTerSimGet1Fanin0(pGVar5);
                uVar8 = 0x40000000;
                if ((uVar10 >> 0x3d & 1) == 0) {
                  uVar8 = local_58;
                }
                if ((uVar7 == uVar8) && (iVar2 != 0)) {
                  uVar10 = (uVar10 & 0xbfffffff3fffffff) + 0x4000000000000000;
                }
                else {
                  uVar10 = uVar10 | 0x4000000040000000;
                }
              }
              else {
LAB_00482374:
                uVar10 = uVar10 & 0xbfffffff3fffffff | 0x40000000;
              }
              *(ulong *)pGVar5 = uVar10;
            }
          }
          for (iVar12 = 0; iVar12 < p->vCos->nSize; iVar12 = iVar12 + 1) {
            pGVar5 = Gia_ManCo(p,iVar12);
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar10 = *(ulong *)pGVar5;
            if ((-1 < (int)(uint)uVar10) || (uVar9 = (uint)uVar10 & 0x1fffffff, uVar9 == 0x1fffffff)
               ) {
              __assert_fail("Gia_ObjIsCo(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x3a7,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
            }
            if (((undefined1  [12])pGVar5[-(ulong)uVar9] & (undefined1  [12])0x4000000040000000) ==
                (undefined1  [12])0x0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x3a8,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
            }
            iVar2 = Gia_ObjTerSimGet0Fanin0(pGVar5);
            if (iVar2 == 0) {
              iVar2 = Gia_ObjTerSimGet1Fanin0(pGVar5);
              if (iVar2 == 0) {
                uVar10 = uVar10 | 0x4000000040000000;
              }
              else {
                uVar10 = (uVar10 & 0xbfffffffbfffffff) + 0x4000000000000000;
              }
            }
            else {
              uVar10 = uVar10 & 0xbfffffffbfffffff | 0x40000000;
            }
            *(ulong *)pGVar5 = uVar10;
          }
          for (iVar12 = 0; iVar12 < p->nObjs; iVar12 = iVar12 + 1) {
            pGVar5 = Gia_ManObj(p,iVar12);
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            if ((~*(ulong *)pGVar5 & 0x4000000040000000) != 0) {
              iVar2 = pAVar4->nPis * iVar11 + pAVar4->nRegs + iVar12;
              (&pAVar4[1].iPo)[iVar2 >> 5] =
                   (&pAVar4[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
            }
          }
        }
        pGVar5 = Gia_ManPo(p,pCex->iPo);
        if (((undefined1  [12])*pGVar5 & (undefined1  [12])0x4000000040000000) ==
            (undefined1  [12])0x4000000000000000) {
          return pAVar4;
        }
        __assertion = "Gia_ObjTerSimGet1(pObj)";
        uVar9 = 0x55;
      }
      else {
        __assertion = "pCex->nBits == pCexCare->nBits";
        uVar9 = 0x35;
      }
    }
    else {
      __assertion = "pCex->nRegs == pCexCare->nRegs";
      uVar9 = 0x34;
    }
  }
  else {
    __assertion = "pCex->nPis == pCexCare->nPis";
    uVar9 = 0x33;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                ,uVar9,
                "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Takes CEX and its care-set. Returns care-set of all objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_CexCareExtendToObjects( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k;
    assert( pCex->nPis == pCexCare->nPis );
    assert( pCex->nRegs == pCexCare->nRegs );
    assert( pCex->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( pCex->nRegs, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // initialize terminary simulation
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        // add cares to the exdended counter-example
        Gia_ManForEachObj( p, pObj, k )
            if ( !Gia_ObjTerSimGetX(pObj) )
                Abc_InfoSetBit( pNew->pData, pNew->nRegs + pNew->nPis * i + k );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Gia_ObjTerSimGet1(pObj) );
    return pNew;
}